

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_info_from_file(FILE *f,int *x,int *y,int *comp)

{
  int iVar1;
  FILE *f_00;
  FILE *in_RDI;
  long pos;
  stbi__context s;
  int r;
  stbi__context *in_stack_ffffffffffffff00;
  stbi__context *in_stack_ffffffffffffff08;
  
  f_00 = (FILE *)ftell(in_RDI);
  stbi__start_file(in_stack_ffffffffffffff00,f_00);
  iVar1 = stbi__info_main(in_stack_ffffffffffffff08,(int *)in_stack_ffffffffffffff00,&f_00->_flags,
                          (int *)0x192abc);
  fseek(in_RDI,(long)f_00,0);
  return iVar1;
}

Assistant:

STBIDEF int stbi_info_from_file(FILE *f, int *x, int *y, int *comp)
{
   int r;
   stbi__context s;
   long pos = ftell(f);
   stbi__start_file(&s, f);
   r = stbi__info_main(&s,x,y,comp);
   fseek(f,pos,SEEK_SET);
   return r;
}